

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::GetRPath
          (cmComputeLinkInformation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *runtimeDirs,bool for_install)

{
  cmMakefile *pcVar1;
  size_type sVar2;
  cmGeneratorTarget *pcVar3;
  pointer pbVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  string *__lhs;
  char *pcVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  string *c2;
  long lVar11;
  string *c2_00;
  LinkClosure *pLVar12;
  byte bVar13;
  pointer pbVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar15;
  string d;
  string rootPath;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string suffix;
  string targetOutputDir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emitted,"CMAKE_SKIP_RPATH",(allocator<char> *)&targetOutputDir);
  bVar5 = cmMakefile::IsOn(pcVar1,(string *)&emitted);
  sVar2 = (this->RuntimeFlag)._M_string_length;
  std::__cxx11::string::~string((string *)&emitted);
  bVar6 = true;
  if (!for_install) {
    pcVar3 = this->Target;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&emitted,"BUILD_WITH_INSTALL_RPATH",(allocator<char> *)&targetOutputDir);
    bVar6 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,(string *)&emitted);
    std::__cxx11::string::~string((string *)&emitted);
  }
  if (bVar5 || sVar2 == 0) {
    bVar8 = 0;
LAB_002afd7e:
    bVar13 = 0;
    bVar7 = false;
  }
  else {
    bVar5 = cmGeneratorTarget::HaveInstallTreeRPATH(this->Target);
    bVar7 = cmGeneratorTarget::HaveBuildTreeRPATH(this->Target,&this->Config);
    bVar8 = bVar7 & (bVar6 ^ 1U);
    if ((bVar6 ^ 1U) != 0) goto LAB_002afd7e;
    pcVar1 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&emitted,"CMAKE_SKIP_INSTALL_RPATH",(allocator<char> *)&rootPath);
    bVar7 = cmMakefile::IsOn(pcVar1,(string *)&emitted);
    if (bVar7) {
      bVar7 = false;
    }
    else {
      pcVar3 = this->Target;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&targetOutputDir,"INSTALL_RPATH_USE_LINK_PATH",(allocator<char> *)&d);
      bVar7 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,&targetOutputDir);
      std::__cxx11::string::~string((string *)&targetOutputDir);
    }
    bVar13 = bVar6 & bVar5;
    std::__cxx11::string::~string((string *)&emitted);
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emitted,"CMAKE_SHARED_LIBRARY_RPATH_ORIGIN_TOKEN",
             (allocator<char> *)&targetOutputDir);
  __lhs = cmMakefile::GetSafeDefinition(pcVar1,(string *)&emitted);
  std::__cxx11::string::~string((string *)&emitted);
  cmGeneratorTarget::GetDirectory(&targetOutputDir,this->Target,&this->Config,RuntimeBinaryArtifact)
  ;
  pcVar3 = this->Target;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emitted,"BUILD_RPATH_USE_ORIGIN",(allocator<char> *)&rootPath);
  bVar5 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,(string *)&emitted);
  sVar2 = __lhs->_M_string_length;
  std::__cxx11::string::~string((string *)&emitted);
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &emitted._M_t._M_impl.super__Rb_tree_header._M_header;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (bVar13 != 0) {
    pcVar3 = this->Target;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rootPath,"INSTALL_RPATH",(allocator<char> *)&d);
    pcVar9 = cmGeneratorTarget::GetProperty(pcVar3,&rootPath);
    std::__cxx11::string::~string((string *)&rootPath);
    cmCLI_ExpandListUnique(pcVar9,runtimeDirs,&emitted);
  }
  if (bVar8 == 0) {
    if (bVar7 == false) goto LAB_002b0454;
  }
  else {
    pcVar3 = this->Target;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rootPath,"BUILD_RPATH",(allocator<char> *)&d);
    pcVar9 = cmGeneratorTarget::GetProperty(pcVar3,&rootPath);
    std::__cxx11::string::~string((string *)&rootPath);
    if (pcVar9 != (char *)0x0) {
      cmCLI_ExpandListUnique(pcVar9,runtimeDirs,&emitted);
    }
  }
  rootPath._M_dataplus._M_p = (pointer)&rootPath.field_2;
  rootPath._M_string_length = 0;
  rootPath.field_2._M_local_buf[0] = '\0';
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&d,"CMAKE_SYSROOT_LINK",(allocator<char> *)&suffix);
  pcVar9 = cmMakefile::GetDefinition(pcVar1,&d);
  std::__cxx11::string::~string((string *)&d);
  if (pcVar9 == (char *)0x0) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&d,"CMAKE_SYSROOT",(allocator<char> *)&suffix);
    cmMakefile::GetSafeDefinition(pcVar1,&d);
    std::__cxx11::string::_M_assign((string *)&rootPath);
    std::__cxx11::string::~string((string *)&d);
  }
  else {
    std::__cxx11::string::assign((char *)&rootPath);
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&d,"CMAKE_STAGING_PREFIX",(allocator<char> *)&suffix);
  pcVar9 = cmMakefile::GetDefinition(pcVar1,&d);
  std::__cxx11::string::~string((string *)&d);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&d,"CMAKE_INSTALL_PREFIX",(allocator<char> *)&suffix);
  cmMakefile::GetSafeDefinition(pcVar1,&d);
  std::__cxx11::string::~string((string *)&d);
  cmsys::SystemTools::ConvertToUnixSlashes(&rootPath);
  pvVar10 = GetRuntimeSearchPath_abi_cxx11_(this);
  c2 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  pbVar4 = (pvVar10->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar14 = (pvVar10->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar4;
      pbVar14 = pbVar14 + 1) {
    if (bVar8 == 0) {
      if (bVar7 != false) {
        c2_00 = cmake::GetHomeDirectory_abi_cxx11_(this->CMakeInstance);
        bVar6 = cmsys::SystemTools::ComparePath(pbVar14,c2_00);
        if (!bVar6) {
          bVar6 = cmsys::SystemTools::ComparePath(pbVar14,c2);
          if (bVar6) goto LAB_002b03e0;
          bVar6 = cmsys::SystemTools::IsSubDirectory(pbVar14,c2_00);
          if (bVar6) goto LAB_002b03e0;
          bVar6 = cmsys::SystemTools::IsSubDirectory(pbVar14,c2);
          if (bVar6) goto LAB_002b03e0;
          std::__cxx11::string::string((string *)&d,(string *)pbVar14);
          if (rootPath._M_string_length == 0) {
LAB_002b02a0:
            if ((pcVar9 != (char *)0x0) && (*pcVar9 != '\0')) {
              lVar11 = std::__cxx11::string::find((char *)&d,(ulong)pcVar9);
              if (lVar11 == 0) {
                strlen(pcVar9);
                std::__cxx11::string::substr((ulong)&suffix,(ulong)&d);
                std::__cxx11::string::_M_assign((string *)&d);
                std::__cxx11::string::append((char *)&d);
                std::__cxx11::string::append((string *)&d);
                cmsys::SystemTools::ConvertToUnixSlashes(&d);
                goto LAB_002b0424;
              }
            }
          }
          else {
            lVar11 = std::__cxx11::string::find((string *)&d,(ulong)&rootPath);
            if (lVar11 != 0) goto LAB_002b02a0;
            std::__cxx11::string::substr((ulong)&suffix,(ulong)&d);
            std::__cxx11::string::operator=((string *)&d,(string *)&suffix);
LAB_002b0424:
            std::__cxx11::string::~string((string *)&suffix);
          }
          pVar15 = std::
                   _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   ::_M_insert_unique<std::__cxx11::string_const&>
                             ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                               *)&emitted,&d);
          if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       runtimeDirs,&d);
          }
          goto LAB_002b03d8;
        }
      }
    }
    else {
      std::__cxx11::string::string((string *)&d,(string *)pbVar14);
      if (rootPath._M_string_length == 0) {
LAB_002b0129:
        if ((pcVar9 != (char *)0x0) && (*pcVar9 != '\0')) {
          lVar11 = std::__cxx11::string::find((char *)&d,(ulong)pcVar9);
          if (lVar11 == 0) {
            strlen(pcVar9);
            std::__cxx11::string::substr((ulong)&suffix,(ulong)&d);
            std::__cxx11::string::_M_assign((string *)&d);
            std::__cxx11::string::append((char *)&d);
            std::__cxx11::string::append((string *)&d);
            cmsys::SystemTools::ConvertToUnixSlashes(&d);
            __return_storage_ptr__ = &suffix;
            goto LAB_002b03b4;
          }
        }
        if ((bVar5 && targetOutputDir._M_string_length != 0) && sVar2 != 0) {
          bVar6 = cmsys::SystemTools::ComparePath(&d,c2);
          if (!bVar6) {
            bVar6 = cmsys::SystemTools::IsSubDirectory(&d,c2);
            if (!bVar6) goto LAB_002b03b9;
          }
          cmSystemTools::RelativePath(&suffix,&targetOutputDir,&d);
          std::__cxx11::string::operator=((string *)&d,(string *)&suffix);
          std::__cxx11::string::~string((string *)&suffix);
          if (d._M_string_length != 0) {
            __return_storage_ptr__ = &local_50;
            std::operator+(__return_storage_ptr__,__lhs,"/");
            std::operator+(&suffix,__return_storage_ptr__,&d);
            std::__cxx11::string::operator=((string *)&d,(string *)&suffix);
            std::__cxx11::string::~string((string *)&suffix);
            goto LAB_002b03b4;
          }
          std::__cxx11::string::_M_assign((string *)&d);
        }
      }
      else {
        lVar11 = std::__cxx11::string::find((string *)&d,(ulong)&rootPath);
        if (lVar11 != 0) goto LAB_002b0129;
        __return_storage_ptr__ = &suffix;
        std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&d);
        std::__cxx11::string::operator=((string *)&d,(string *)__return_storage_ptr__);
LAB_002b03b4:
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
LAB_002b03b9:
      pVar15 = std::
               _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               ::_M_insert_unique<std::__cxx11::string_const&>
                         ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           *)&emitted,&d);
      if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)runtimeDirs,
                   &d);
      }
LAB_002b03d8:
      std::__cxx11::string::~string((string *)&d);
    }
LAB_002b03e0:
  }
  std::__cxx11::string::~string((string *)&rootPath);
LAB_002b0454:
  pLVar12 = cmGeneratorTarget::GetLinkClosure(this->Target,&this->Config);
  pbVar4 = (pLVar12->Languages).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar14 = (pLVar12->Languages).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar4; pbVar14 = pbVar14 + 1
      ) {
    std::operator+(&d,"CMAKE_",pbVar14);
    std::operator+(&rootPath,&d,"_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH");
    std::__cxx11::string::~string((string *)&d);
    bVar5 = cmMakefile::IsOn(this->Makefile,&rootPath);
    if (bVar5) {
      std::operator+(&suffix,"CMAKE_",pbVar14);
      std::operator+(&d,&suffix,"_IMPLICIT_LINK_DIRECTORIES");
      std::__cxx11::string::~string((string *)&suffix);
      pcVar9 = cmMakefile::GetDefinition(this->Makefile,&d);
      if (pcVar9 != (char *)0x0) {
        cmCLI_ExpandListUnique(pcVar9,runtimeDirs,&emitted);
      }
      std::__cxx11::string::~string((string *)&d);
    }
    std::__cxx11::string::~string((string *)&rootPath);
  }
  cmCLI_ExpandListUnique((this->RuntimeAlways)._M_dataplus._M_p,runtimeDirs,&emitted);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&emitted._M_t);
  std::__cxx11::string::~string((string *)&targetOutputDir);
  return;
}

Assistant:

void cmComputeLinkInformation::GetRPath(std::vector<std::string>& runtimeDirs,
                                        bool for_install) const
{
  // Select whether to generate runtime search directories.
  bool outputRuntime =
    !this->Makefile->IsOn("CMAKE_SKIP_RPATH") && !this->RuntimeFlag.empty();

  // Select whether to generate an rpath for the install tree or the
  // build tree.
  bool linking_for_install =
    (for_install ||
     this->Target->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH"));
  bool use_install_rpath =
    (outputRuntime && this->Target->HaveInstallTreeRPATH() &&
     linking_for_install);
  bool use_build_rpath =
    (outputRuntime && this->Target->HaveBuildTreeRPATH(this->Config) &&
     !linking_for_install);
  bool use_link_rpath = outputRuntime && linking_for_install &&
    !this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH") &&
    this->Target->GetPropertyAsBool("INSTALL_RPATH_USE_LINK_PATH");

  // Select whether to use $ORIGIN in RPATHs for artifacts in the build tree.
  std::string const& originToken = this->Makefile->GetSafeDefinition(
    "CMAKE_SHARED_LIBRARY_RPATH_ORIGIN_TOKEN");
  std::string targetOutputDir = this->Target->GetDirectory(this->Config);
  bool use_relative_build_rpath =
    this->Target->GetPropertyAsBool("BUILD_RPATH_USE_ORIGIN") &&
    !originToken.empty() && !targetOutputDir.empty();

  // Construct the RPATH.
  std::set<std::string> emitted;
  if (use_install_rpath) {
    const char* install_rpath = this->Target->GetProperty("INSTALL_RPATH");
    cmCLI_ExpandListUnique(install_rpath, runtimeDirs, emitted);
  }
  if (use_build_rpath) {
    // Add directories explicitly specified by user
    if (const char* build_rpath = this->Target->GetProperty("BUILD_RPATH")) {
      // This will not resolve entries to use $ORIGIN, the user is expected to
      // do that if necessary.
      cmCLI_ExpandListUnique(build_rpath, runtimeDirs, emitted);
    }
  }
  if (use_build_rpath || use_link_rpath) {
    std::string rootPath;
    if (const char* sysrootLink =
          this->Makefile->GetDefinition("CMAKE_SYSROOT_LINK")) {
      rootPath = sysrootLink;
    } else {
      rootPath = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
    }
    const char* stagePath =
      this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX");
    std::string const& installPrefix =
      this->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
    cmSystemTools::ConvertToUnixSlashes(rootPath);
    std::vector<std::string> const& rdirs = this->GetRuntimeSearchPath();
    std::string const& topBinaryDir =
      this->CMakeInstance->GetHomeOutputDirectory();
    for (std::string const& ri : rdirs) {
      // Put this directory in the rpath if using build-tree rpath
      // support or if using the link path as an rpath.
      if (use_build_rpath) {
        std::string d = ri;
        if (!rootPath.empty() && d.find(rootPath) == 0) {
          d = d.substr(rootPath.size());
        } else if (stagePath && *stagePath && d.find(stagePath) == 0) {
          std::string suffix = d.substr(strlen(stagePath));
          d = installPrefix;
          d += "/";
          d += suffix;
          cmSystemTools::ConvertToUnixSlashes(d);
        } else if (use_relative_build_rpath) {
          // If expansion of the $ORIGIN token is supported and permitted per
          // policy, use relative paths in the RPATH.
          if (cmSystemTools::ComparePath(d, topBinaryDir) ||
              cmSystemTools::IsSubDirectory(d, topBinaryDir)) {
            d = cmSystemTools::RelativePath(targetOutputDir, d);
            if (!d.empty()) {
              d = originToken + "/" + d;
            } else {
              d = originToken;
            }
          }
        }
        if (emitted.insert(d).second) {
          runtimeDirs.push_back(std::move(d));
        }
      } else if (use_link_rpath) {
        // Do not add any path inside the source or build tree.
        std::string const& topSourceDir =
          this->CMakeInstance->GetHomeDirectory();
        if (!cmSystemTools::ComparePath(ri, topSourceDir) &&
            !cmSystemTools::ComparePath(ri, topBinaryDir) &&
            !cmSystemTools::IsSubDirectory(ri, topSourceDir) &&
            !cmSystemTools::IsSubDirectory(ri, topBinaryDir)) {
          std::string d = ri;
          if (!rootPath.empty() && d.find(rootPath) == 0) {
            d = d.substr(rootPath.size());
          } else if (stagePath && *stagePath && d.find(stagePath) == 0) {
            std::string suffix = d.substr(strlen(stagePath));
            d = installPrefix;
            d += "/";
            d += suffix;
            cmSystemTools::ConvertToUnixSlashes(d);
          }
          if (emitted.insert(d).second) {
            runtimeDirs.push_back(std::move(d));
          }
        }
      }
    }
  }

  // Add runtime paths required by the languages to always be
  // present.  This is done even when skipping rpath support.
  {
    cmGeneratorTarget::LinkClosure const* lc =
      this->Target->GetLinkClosure(this->Config);
    for (std::string const& li : lc->Languages) {
      std::string useVar =
        "CMAKE_" + li + "_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH";
      if (this->Makefile->IsOn(useVar)) {
        std::string dirVar = "CMAKE_" + li + "_IMPLICIT_LINK_DIRECTORIES";
        if (const char* dirs = this->Makefile->GetDefinition(dirVar)) {
          cmCLI_ExpandListUnique(dirs, runtimeDirs, emitted);
        }
      }
    }
  }

  // Add runtime paths required by the platform to always be
  // present.  This is done even when skipping rpath support.
  cmCLI_ExpandListUnique(this->RuntimeAlways.c_str(), runtimeDirs, emitted);
}